

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_identityDictionary_primitive_at
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t found;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  found = (sysbvm_tuple_t)arguments;
  arguments_local = (sysbvm_tuple_t *)argumentCount;
  argumentCount_local = closure;
  closure_local = (sysbvm_tuple_t)context;
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30 = 0;
  _Var1 = sysbvm_identityDictionary_find
                    (*(sysbvm_tuple_t *)found,*(sysbvm_tuple_t *)(found + 8),&local_30);
  if (!_Var1) {
    sysbvm_error("Failed to find the expected key in the dictionary.");
  }
  return local_30;
}

Assistant:

static sysbvm_tuple_t sysbvm_identityDictionary_primitive_at(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t found = SYSBVM_NULL_TUPLE;
    if(!sysbvm_identityDictionary_find(arguments[0], arguments[1], &found))
        sysbvm_error("Failed to find the expected key in the dictionary.");

    return found;
}